

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg)

{
  bool bVar1;
  ImGuiWindowTempData *lhs;
  bool local_5a;
  bool local_59;
  bool pressed;
  bool held;
  ImVec2 IStack_58;
  bool hovered;
  undefined1 local_50 [8];
  ImRect bb;
  ImVec2 local_34;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *size_arg_local;
  char *str_id_local;
  
  register0x00000000 = GetCurrentWindow();
  if ((register0x00000000->SkipItems & 1U) == 0) {
    size.x = (float)ImGuiWindow::GetID(register0x00000000,str_id,(char *)0x0);
    bb.Max = *size_arg;
    local_34 = CalcItemSize(bb.Max,0.0,0.0);
    lhs = &stack0xffffffffffffffd8->DC;
    IStack_58 = ::operator+(&lhs->CursorPos,&local_34);
    ImRect::ImRect((ImRect *)local_50,&lhs->CursorPos,&stack0xffffffffffffffa8);
    ItemSize((ImRect *)local_50,0.0);
    bVar1 = ItemAdd((ImRect *)local_50,(ImGuiID)size.x,(ImRect *)0x0);
    if (bVar1) {
      str_id_local._7_1_ = ButtonBehavior((ImRect *)local_50,(ImGuiID)size.x,&local_59,&local_5a,0);
    }
    else {
      str_id_local._7_1_ = false;
    }
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(bb);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    return pressed;
}